

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
edition_unittest::TestNestedMessageHasBits_NestedMessage::_InternalSerialize
          (TestNestedMessageHasBits_NestedMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  RepeatedField<int> *this_00;
  LogMessage *pLVar4;
  const_pointer piVar5;
  RepeatedPtrField<edition_unittest::ForeignMessage> *this_01;
  const_reference this_02;
  UnknownFieldSet *unknown_fields;
  const_pointer piVar6;
  ForeignMessage *repfield;
  uint n;
  uint i;
  int byte_size;
  uint32_t cached_has_bits;
  TestNestedMessageHasBits_NestedMessage *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestNestedMessageHasBits_NestedMessage *this_local;
  const_pointer end;
  const_pointer it;
  EpsCopyOutputStream *local_b0;
  byte *local_88;
  ulong local_80;
  LogMessage local_58;
  Voidify local_41;
  byte *local_40;
  undefined4 local_38;
  undefined4 local_34;
  EpsCopyOutputStream *local_30;
  byte *local_28;
  uint local_1c;
  EpsCopyOutputStream *local_18;
  uint local_c;
  
  uVar2 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._nestedmessage_repeated_int32_cached_byte_size_);
  stream_local = (EpsCopyOutputStream *)target;
  if (0 < (int)uVar2) {
    this_00 = _internal_nestedmessage_repeated_int32(this);
    local_40 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    local_34 = 1;
    local_38 = 2;
    local_30 = stream;
    if (stream->end_ <= local_40) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    }
    local_1c = 10;
    local_28 = local_40;
    while (0x7f < local_1c) {
      *local_28 = (byte)local_1c | 0x80;
      local_28 = local_28 + 1;
      local_1c = 0;
    }
    *local_28 = (byte)local_1c;
    local_18 = (EpsCopyOutputStream *)(local_28 + 1);
    for (local_c = uVar2; 0x7f < local_c; local_c = local_c >> 7) {
      *(byte *)local_18 = (byte)local_c | 0x80;
      local_18 = (EpsCopyOutputStream *)((long)local_18 + 1);
    }
    local_b0 = (EpsCopyOutputStream *)((long)local_18 + 1);
    *(byte *)local_18 = (byte)local_c;
    local_28 = local_28 + 1;
    local_18 = local_b0;
    piVar5 = google::protobuf::RepeatedField<int>::data(this_00);
    iVar3 = google::protobuf::RepeatedField<int>::size(this_00);
    end = piVar5;
    do {
      local_88 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_b0);
      piVar6 = end + 1;
      for (local_80 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end);
          0x7f < local_80; local_80 = local_80 >> 7) {
        *local_88 = (byte)local_80 | 0x80;
        local_88 = local_88 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_88 + 1);
      *local_88 = (byte)local_80;
      end = piVar6;
      local_b0 = stream_local;
    } while (piVar6 < piVar5 + iVar3);
  }
  repfield._4_4_ = 0;
  uVar2 = _internal_nestedmessage_repeated_foreignmessage_size(this);
  for (; repfield._4_4_ < uVar2; repfield._4_4_ = repfield._4_4_ + 1) {
    this_01 = _internal_nestedmessage_repeated_foreignmessage(this);
    this_02 = google::protobuf::RepeatedPtrField<edition_unittest::ForeignMessage>::Get
                        (this_01,repfield._4_4_);
    iVar3 = edition_unittest::ForeignMessage::GetCachedSize(this_02);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (2,(MessageLite *)this_02,iVar3,(uint8_t *)stream_local,stream);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestNestedMessageHasBits_NestedMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestNestedMessageHasBits_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestNestedMessageHasBits.NestedMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 nestedmessage_repeated_int32 = 1;
  {
    int byte_size = this_._impl_._nestedmessage_repeated_int32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, this_._internal_nestedmessage_repeated_int32(), byte_size, target);
    }
  }

  // repeated .edition_unittest.ForeignMessage nestedmessage_repeated_foreignmessage = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_nestedmessage_repeated_foreignmessage_size());
       i < n; i++) {
    const auto& repfield = this_._internal_nestedmessage_repeated_foreignmessage().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestNestedMessageHasBits.NestedMessage)
  return target;
}